

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5RollbackMethod(sqlite3_vtab *pVtab)

{
  int iVar1;
  
  iVar1 = sqlite3Fts5StorageRollback((Fts5Storage *)pVtab[1].zErrMsg);
  *(undefined4 *)((long)&(pVtab[1].pModule)->xIntegrity + 4) = 0;
  return iVar1;
}

Assistant:

static int fts5RollbackMethod(sqlite3_vtab *pVtab){
  int rc;
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  fts5CheckTransactionState(pTab, FTS5_ROLLBACK, 0);
  rc = sqlite3Fts5StorageRollback(pTab->pStorage);
  pTab->p.pConfig->pgsz = 0;
  return rc;
}